

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::SSARewriter::ReplacePhiUsersWith
          (SSARewriter *this,PhiCandidate *phi_to_remove,uint32_t repl_id)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  pointer puVar3;
  Instruction *this_00;
  uint32_t uVar4;
  uint32_t *arg;
  PhiCandidate *pPVar5;
  BasicBlock *bb;
  pointer puVar6;
  _Hash_node_base *p_Var7;
  uint32_t *puVar8;
  
  puVar2 = (phi_to_remove->users_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (phi_to_remove->users_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    uVar1 = *puVar8;
    pPVar5 = GetPhiCandidate(this,uVar1);
    bb = IRContext::get_instr_block((this->pass_->super_Pass).context_,uVar1);
    if (pPVar5 == (PhiCandidate *)0x0) {
      this_00 = (bb->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar4 = 0;
      if (this_00->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
      }
      if (uVar4 == uVar1) {
        WriteVariable(this,phi_to_remove->var_id_,bb,repl_id);
      }
      else {
        p_Var7 = (this->load_replacement_)._M_h._M_before_begin._M_nxt;
        if (p_Var7 != (_Hash_node_base *)0x0) {
          uVar1 = phi_to_remove->result_id_;
          do {
            if (*(uint32_t *)((long)&p_Var7[1]._M_nxt + 4) == uVar1) {
              *(uint32_t *)((long)&p_Var7[1]._M_nxt + 4) = repl_id;
            }
            p_Var7 = p_Var7->_M_nxt;
          } while (p_Var7 != (_Hash_node_base *)0x0);
        }
      }
    }
    else {
      puVar3 = (pPVar5->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (puVar6 = (pPVar5->phi_args_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar6 != puVar3; puVar6 = puVar6 + 1) {
        if (*puVar6 == phi_to_remove->result_id_) {
          *puVar6 = repl_id;
        }
      }
    }
  }
  return;
}

Assistant:

void SSARewriter::ReplacePhiUsersWith(const PhiCandidate& phi_to_remove,
                                      uint32_t repl_id) {
  for (uint32_t user_id : phi_to_remove.users()) {
    PhiCandidate* user_phi = GetPhiCandidate(user_id);
    BasicBlock* bb = pass_->context()->get_instr_block(user_id);
    if (user_phi) {
      // If the user is a Phi candidate, replace all arguments that refer to
      // |phi_to_remove.result_id()| with |repl_id|.
      for (uint32_t& arg : user_phi->phi_args()) {
        if (arg == phi_to_remove.result_id()) {
          arg = repl_id;
        }
      }
    } else if (bb->id() == user_id) {
      // The phi candidate is the definition of the variable at basic block
      // |bb|.  We must change this to the replacement.
      WriteVariable(phi_to_remove.var_id(), bb, repl_id);
    } else {
      // For regular loads, traverse the |load_replacement_| table looking for
      // instances of |phi_to_remove|.
      for (auto& it : load_replacement_) {
        if (it.second == phi_to_remove.result_id()) {
          it.second = repl_id;
        }
      }
    }
  }
}